

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_column_reader.hpp
# Opt level: O1

string_t duckdb::StringParquetValueConversion::PlainRead<true>
                   (ByteBuffer *plain_data,ColumnReader *reader)

{
  data_ptr_t str_data;
  anon_union_16_2_67f50693_for_value aVar1;
  StringColumnReader *pSVar2;
  ulong req_len;
  uint str_len;
  idx_t iVar3;
  string_t ret_str;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pSVar2 = ColumnReader::Cast<duckdb::StringColumnReader>(reader);
  iVar3 = pSVar2->fixed_width_string_length;
  if (iVar3 == 0) {
    ByteBuffer::available(plain_data,4);
    iVar3 = (idx_t)*(uint *)plain_data->ptr;
    plain_data->len = plain_data->len - 4;
    plain_data->ptr = (data_ptr_t)((long)plain_data->ptr + 4);
  }
  str_len = (uint)iVar3;
  req_len = iVar3 & 0xffffffff;
  ByteBuffer::available(plain_data,req_len);
  str_data = plain_data->ptr;
  StringColumnReader::VerifyString
            ((char *)str_data,str_len,
             (((pSVar2->super_ColumnReader).column_schema)->type).id_ == VARCHAR);
  if (str_len < 0xd) {
    uStack_2c = 0;
    uStack_34 = 0;
    uStack_30 = 0;
    if (req_len != 0) {
      switchD_012dd528::default(&uStack_34,str_data,req_len);
    }
  }
  else {
    uStack_34 = *(undefined4 *)str_data;
    uStack_30 = SUB84(str_data,0);
    uStack_2c = (undefined4)((ulong)str_data >> 0x20);
  }
  ByteBuffer::available(plain_data,req_len);
  plain_data->len = plain_data->len - req_len;
  plain_data->ptr = plain_data->ptr + req_len;
  aVar1._4_1_ = (undefined1)uStack_34;
  aVar1._5_1_ = uStack_34._1_1_;
  aVar1._6_1_ = uStack_34._2_1_;
  aVar1._7_1_ = uStack_34._3_1_;
  aVar1.pointer.length = str_len;
  aVar1._8_4_ = uStack_30;
  aVar1._12_4_ = uStack_2c;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

static string_t PlainRead(ByteBuffer &plain_data, ColumnReader &reader) {
		auto &scr = reader.Cast<StringColumnReader>();
		uint32_t str_len =
		    scr.fixed_width_string_length == 0 ? plain_data.read<uint32_t>() : scr.fixed_width_string_length;
		plain_data.available(str_len);
		auto plain_str = char_ptr_cast(plain_data.ptr);
		scr.VerifyString(plain_str, str_len);
		auto ret_str = string_t(plain_str, str_len);
		plain_data.inc(str_len);
		return ret_str;
	}